

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FileDescriptorProto::SharedDtor(MessageLite *self)

{
  FileOptions *this;
  SourceCodeInfo *this_00;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  FileDescriptorProto *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (FileDescriptorProto *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[0xc]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 0xd));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[0xd]._internal_metadata_);
    this = (FileOptions *)local_18[0xe]._vptr_MessageLite;
    if (this != (FileOptions *)0x0) {
      FileOptions::~FileOptions(this);
      operator_delete(this,0xb0);
    }
    this_00 = (SourceCodeInfo *)local_18[0xe]._internal_metadata_.ptr_;
    if (this_00 != (SourceCodeInfo *)0x0) {
      SourceCodeInfo::~SourceCodeInfo(this_00);
      operator_delete(this_00,0x48);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0xa43,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void FileDescriptorProto::SharedDtor(MessageLite& self) {
  FileDescriptorProto& this_ = static_cast<FileDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.package_.Destroy();
  this_._impl_.syntax_.Destroy();
  delete this_._impl_.options_;
  delete this_._impl_.source_code_info_;
  this_._impl_.~Impl_();
}